

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderValidatePush(xmlTextReaderPtr reader)

{
  uint uVar1;
  xmlChar **qname_00;
  int local_64;
  int ret;
  xmlChar *qname;
  xmlChar buf [50];
  xmlNodePtr node;
  xmlTextReaderPtr reader_local;
  
  unique0x00012000 = reader->node;
  if (((reader->validate == XML_TEXTREADER_VALIDATE_DTD) && (reader->ctxt != (xmlParserCtxtPtr)0x0))
     && (reader->ctxt->validate == 1)) {
    if ((unique0x00012000->ns == (xmlNs *)0x0) || (unique0x00012000->ns->prefix == (xmlChar *)0x0))
    {
      uVar1 = xmlValidatePushElement
                        (&reader->ctxt->vctxt,reader->ctxt->myDoc,unique0x00012000,
                         unique0x00012000->name);
      reader->ctxt->valid = uVar1 & reader->ctxt->valid;
    }
    else {
      qname_00 = (xmlChar **)
                 xmlBuildQName(unique0x00012000->name,unique0x00012000->ns->prefix,(xmlChar *)&qname
                               ,0x32);
      if (qname_00 == (xmlChar **)0x0) {
        xmlTextReaderErrMemory(reader);
        return -1;
      }
      uVar1 = xmlValidatePushElement
                        (&reader->ctxt->vctxt,reader->ctxt->myDoc,stack0xffffffffffffffe0,
                         (xmlChar *)qname_00);
      reader->ctxt->valid = uVar1 & reader->ctxt->valid;
      if (qname_00 != &qname) {
        (*xmlFree)(qname_00);
      }
    }
  }
  if ((reader->validate == XML_TEXTREADER_VALIDATE_RNG) &&
     (reader->rngValidCtxt != (xmlRelaxNGValidCtxtPtr)0x0)) {
    if (reader->rngFullNode != (xmlNodePtr)0x0) {
      return 0;
    }
    local_64 = xmlRelaxNGValidatePushElement
                         (reader->rngValidCtxt,reader->ctxt->myDoc,stack0xffffffffffffffe0);
    if (local_64 == 0) {
      register0x00000000 = xmlTextReaderExpand(reader);
      if (register0x00000000 == (xmlNodePtr)0x0) {
        local_64 = -1;
      }
      else {
        local_64 = xmlRelaxNGValidateFullElement
                             (reader->rngValidCtxt,reader->ctxt->myDoc,register0x00000000);
        reader->rngFullNode = stack0xffffffffffffffe0;
      }
    }
    if (local_64 != 1) {
      reader->rngValidErrors = reader->rngValidErrors + 1;
    }
  }
  return 0;
}

Assistant:

static int
xmlTextReaderValidatePush(xmlTextReaderPtr reader) {
    xmlNodePtr node = reader->node;

#ifdef LIBXML_VALID_ENABLED
    if ((reader->validate == XML_TEXTREADER_VALIDATE_DTD) &&
        (reader->ctxt != NULL) && (reader->ctxt->validate == 1)) {
	if ((node->ns == NULL) || (node->ns->prefix == NULL)) {
	    reader->ctxt->valid &= xmlValidatePushElement(&reader->ctxt->vctxt,
				    reader->ctxt->myDoc, node, node->name);
	} else {
            xmlChar buf[50];
	    xmlChar *qname;

	    qname = xmlBuildQName(node->name, node->ns->prefix, buf, 50);
            if (qname == NULL) {
                xmlTextReaderErrMemory(reader);
                return(-1);
            }
	    reader->ctxt->valid &= xmlValidatePushElement(&reader->ctxt->vctxt,
				    reader->ctxt->myDoc, node, qname);
            if (qname != buf)
	        xmlFree(qname);
	}
        /*if (reader->ctxt->errNo == XML_ERR_NO_MEMORY) {
            reader->mode = XML_TEXTREADER_MODE_ERROR;
            reader->state = XML_TEXTREADER_ERROR;
            return(-1);
        }*/
    }
#endif /* LIBXML_VALID_ENABLED */
#ifdef LIBXML_RELAXNG_ENABLED
    if ((reader->validate == XML_TEXTREADER_VALIDATE_RNG) &&
               (reader->rngValidCtxt != NULL)) {
	int ret;

	if (reader->rngFullNode != NULL) return(0);
	ret = xmlRelaxNGValidatePushElement(reader->rngValidCtxt,
	                                    reader->ctxt->myDoc,
					    node);
	if (ret == 0) {
	    /*
	     * this element requires a full tree
	     */
	    node = xmlTextReaderExpand(reader);
	    if (node == NULL) {
	        ret = -1;
	    } else {
		ret = xmlRelaxNGValidateFullElement(reader->rngValidCtxt,
						    reader->ctxt->myDoc,
						    node);
		reader->rngFullNode = node;
	    }
	}
	if (ret != 1)
	    reader->rngValidErrors++;
    }
#endif

    return(0);
}